

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_list.cxx
# Opt level: O3

int fl_filename_list(char *d,dirent ***list,Fl_File_Sort_F *sort)

{
  char *pcVar1;
  dirent *__ptr;
  __off64_t _Var2;
  uint uVar3;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  char *__dest;
  dirent *pdVar9;
  ulong uVar10;
  uint uVar4;
  
  sVar7 = strlen(d);
  uVar4 = (uint)sVar7;
  uVar3 = uVar4 + 1;
  pcVar8 = (char *)malloc((long)(int)uVar3);
  fl_utf8to_mb(d,uVar4,pcVar8,uVar3);
  uVar5 = scandir64(pcVar8,(dirent64 ***)list,(__selector *)0x0,(__cmp *)sort);
  free(pcVar8);
  pcVar8 = (char *)malloc((long)((sVar7 << 0x20) + 0x80300000000) >> 0x20);
  memcpy(pcVar8,d,(long)(int)uVar3);
  __dest = pcVar8 + (int)uVar4;
  if ((sVar7 << 0x20 != 0) && (__dest[-1] != '/')) {
    *__dest = '/';
    __dest = __dest + 1;
  }
  if (0 < (int)uVar5) {
    uVar10 = 0;
    do {
      __ptr = (*list)[uVar10];
      pcVar1 = __ptr->d_name;
      sVar7 = strlen(pcVar1);
      uVar4 = (uint)sVar7;
      uVar3 = fl_utf8from_mb((char *)0x0,0,pcVar1,uVar4);
      pdVar9 = (dirent *)malloc((long)(int)uVar3 + 0x15);
      _Var2 = __ptr->d_off;
      pdVar9->d_ino = __ptr->d_ino;
      pdVar9->d_off = _Var2;
      *(undefined4 *)((long)&pdVar9->d_off + 7) = *(undefined4 *)((long)&__ptr->d_off + 7);
      fl_utf8from_mb(pdVar9->d_name,uVar3 + 1,pcVar1,uVar4);
      if (((int)uVar4 < 0x801) &&
         (__ptr->d_name[(long)((sVar7 << 0x20) + -0x100000000) >> 0x20] != '/')) {
        memcpy(__dest,pcVar1,(long)((sVar7 << 0x20) + 0x100000000) >> 0x20);
        iVar6 = fl_filename_isdir(pcVar8);
        if (iVar6 != 0) {
          pcVar1 = pdVar9->d_name + (int)uVar3;
          pcVar1[0] = '/';
          pcVar1[1] = '\0';
        }
      }
      free(__ptr);
      (*list)[uVar10] = pdVar9;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  free(pcVar8);
  return uVar5;
}

Assistant:

int fl_filename_list(const char *d, dirent ***list,
                     Fl_File_Sort_F *sort) {
#if defined(WIN32) && !defined(__CYGWIN__) && !defined(HAVE_SCANDIR)
  // For Windows we have a special scandir implementation that uses
  // the Win32 "wide" functions for lookup, avoiding the code page mess
  // entirely. It also fixes up the trailing '/'.
  return fl_scandir(d, list, 0, sort);

#else // WIN32

  int dirlen;
  char *dirloc;

  // Assume that locale encoding is no less dense than UTF-8
  dirlen = strlen(d);
#ifdef __APPLE__
  dirloc = (char *)d;
#else
  dirloc = (char *)malloc(dirlen + 1);
  fl_utf8to_mb(d, dirlen, dirloc, dirlen + 1);
#endif

#ifndef HAVE_SCANDIR
  // This version is when we define our own scandir
  int n = fl_scandir(dirloc, list, 0, sort);
#elif defined(HAVE_SCANDIR_POSIX) && !defined(__APPLE__)
  // POSIX (2008) defines the comparison function like this:
  int n = scandir(dirloc, list, 0, (int(*)(const dirent **, const dirent **))sort);
#elif defined(__osf__)
  // OSF, DU 4.0x
  int n = scandir(dirloc, list, 0, (int(*)(dirent **, dirent **))sort);
#elif defined(_AIX)
  // AIX is almost standard...
  int n = scandir(dirloc, list, 0, (int(*)(void*, void*))sort);
#elif defined(__sgi)
  int n = scandir(dirloc, list, 0, sort);
#elif defined(__APPLE__)
# if MAC_OS_X_VERSION_MAX_ALLOWED >= MAC_OS_X_VERSION_10_8
  int n = scandir(dirloc, list, 0, (int(*)(const struct dirent**,const struct dirent**))sort);
# else
  int n = scandir(dirloc, list, 0, (int(*)(const void*,const void*))sort);
# endif
#else
  // The vast majority of UNIX systems want the sort function to have this
  // prototype, most likely so that it can be passed to qsort without any
  // changes:
  int n = scandir(dirloc, list, 0, (int(*)(const void*,const void*))sort);
#endif

#ifndef __APPLE__
  free(dirloc);
#endif

  // convert every filename to utf-8, and append a '/' to all
  // filenames that are directories
  int i;
  char *fullname = (char*)malloc(dirlen+FL_PATH_MAX+3); // Add enough extra for two /'s and a nul
  // Use memcpy for speed since we already know the length of the string...
  memcpy(fullname, d, dirlen+1);

  char *name = fullname + dirlen;
  if (name!=fullname && name[-1]!='/')
    *name++ = '/';

  for (i=0; i<n; i++) {
    int newlen;
    dirent *de = (*list)[i];
    int len = strlen(de->d_name);
#ifdef __APPLE__
    newlen = len;
#else
    newlen = fl_utf8from_mb(NULL, 0, de->d_name, len);
#endif
    dirent *newde = (dirent*)malloc(de->d_name - (char*)de + newlen + 2); // Add space for a / and a nul

    // Conversion to UTF-8
    memcpy(newde, de, de->d_name - (char*)de);
#ifdef __APPLE__
    strcpy(newde->d_name, de->d_name);
#else
    fl_utf8from_mb(newde->d_name, newlen + 1, de->d_name, len);
#endif

    // Check if dir (checks done on "old" name as we need to interact with
    // the underlying OS)
    if (de->d_name[len-1]!='/' && len<=FL_PATH_MAX) {
      // Use memcpy for speed since we already know the length of the string...
      memcpy(name, de->d_name, len+1);
      if (fl_filename_isdir(fullname)) {
        char *dst = newde->d_name + newlen;
        *dst++ = '/';
        *dst = 0;
      }
    }

    free(de);
    (*list)[i] = newde;
  }
  free(fullname);

  return n;

#endif // WIN32
}